

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (CompilerGLSL *this,string *base_expr,SPIRType *type)

{
  SPIRType *ts;
  bool bVar1;
  uint32_t id;
  SPIRType *in_RCX;
  undefined1 local_b0 [64];
  undefined1 local_70 [8];
  string subexpr;
  uint local_50 [2];
  uint32_t i;
  allocator local_3a;
  char local_39;
  SPIRType *local_38;
  SPIRType *parent;
  SPIRType *pSStack_28;
  uint32_t size;
  SPIRType *type_local;
  string *base_expr_local;
  CompilerGLSL *this_local;
  string *expr;
  
  pSStack_28 = in_RCX;
  type_local = type;
  base_expr_local = base_expr;
  this_local = this;
  parent._4_4_ = to_array_size_literal((CompilerGLSL *)base_expr,in_RCX);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_28->parent_type);
  local_38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)base_expr,id);
  local_39 = '\0';
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)this,"{ ",&local_3a);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  for (local_50[0] = 0; ts = type_local, local_50[0] < parent._4_4_; local_50[0] = local_50[0] + 1)
  {
    convert_to_string<unsigned_int,_0>((spirv_cross *)(local_b0 + 0x20),local_50);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts,
               (char (*) [2])0x5b2ad8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_b0 + 0x20),(char (*) [2])0x5ab046);
    ::std::__cxx11::string::~string((string *)(local_b0 + 0x20));
    bVar1 = VectorView<unsigned_int>::empty(&(local_38->array).super_VectorView<unsigned_int>);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_70);
    }
    else {
      to_rerolled_array_expression((CompilerGLSL *)local_b0,base_expr,(SPIRType *)local_70);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_b0);
      ::std::__cxx11::string::~string((string *)local_b0);
    }
    if (local_50[0] + 1 < parent._4_4_) {
      ::std::__cxx11::string::operator+=((string *)this,", ");
    }
    ::std::__cxx11::string::~string((string *)local_70);
  }
  ::std::__cxx11::string::operator+=((string *)this," }");
  return this;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const string &base_expr, const SPIRType &type)
{
	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (parent.array.empty())
			expr += subexpr;
		else
			expr += to_rerolled_array_expression(subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}